

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_type.cc
# Opt level: O2

void __thiscall Type::GenBufferConfiguration(Type *this,Output *out_cc,Env *env)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  string frame_buffer_arg;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58 [16];
  string local_48;
  
  local_68 = local_58;
  local_60 = 0;
  local_58[0] = 0;
  iVar2 = (*(this->super_DataDepElement)._vptr_DataDepElement[0x16])();
  if (iVar2 == 2) {
    bVar1 = NeedsBufferingStateVar(this);
    if (!bVar1) goto LAB_00122e32;
    pcVar4 = Env::RValue(env,buffering_state_id);
    Output::println(out_cc,"if ( %s == 0 )",pcVar4);
    out_cc->indent_ = out_cc->indent_ + 1;
    Output::println(out_cc,"{");
    if (this->attr_length_expr_ == (Expr *)0x0) {
      if (this->attr_restofflow_ == true) {
        std::__cxx11::string::assign((char *)&local_68);
      }
    }
    else {
      uVar3 = InitialBufferLength(this);
      strfmt_abi_cxx11_(&local_48,"%d",(ulong)uVar3);
      std::__cxx11::string::operator=((string *)&local_68,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
    pcVar4 = Env::LValue(env,flow_buffer_id);
    pcVar5 = "false";
    if (this->attr_chunked_ != false) {
      pcVar5 = "true";
    }
    Output::println(out_cc,"%s->NewFrame(%s, %s);",pcVar4,local_68,pcVar5);
    pcVar4 = Env::LValue(env,buffering_state_id);
    Output::println(out_cc,"%s = 1;",pcVar4);
    Output::println(out_cc,"}");
  }
  else {
    if (iVar2 != 3) goto LAB_00122e32;
    pcVar4 = Env::RValue(env,buffering_state_id);
    Output::println(out_cc,"if ( %s == 0 )",pcVar4);
    out_cc->indent_ = out_cc->indent_ + 1;
    Output::println(out_cc,"{");
    if (this->attr_linebreaker_ == (Expr *)0x0) {
      pcVar4 = Env::LValue(env,flow_buffer_id);
      Output::println(out_cc,"%s->UnsetLineBreaker();",pcVar4);
    }
    else {
      pcVar4 = Env::LValue(env,flow_buffer_id);
      Output::println(out_cc,"%s->SetLineBreaker((unsigned char*)%s);",pcVar4,
                      (this->attr_linebreaker_->orig_)._M_dataplus._M_p);
    }
    pcVar4 = Env::LValue(env,flow_buffer_id);
    Output::println(out_cc,"%s->NewLine();",pcVar4);
    pcVar4 = Env::LValue(env,buffering_state_id);
    Output::println(out_cc,"%s = 1;",pcVar4);
    Output::println(out_cc,"}");
  }
  out_cc->indent_ = out_cc->indent_ + -1;
LAB_00122e32:
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void Type::GenBufferConfiguration(Output* out_cc, Env* env)
	{
	ASSERT(buffer_input());

	string frame_buffer_arg;

	switch ( buffer_mode() )
		{
		case BUFFER_NOTHING:
			break;

		case BUFFER_BY_LENGTH:
			if ( ! NeedsBufferingStateVar() )
				break;

			ASSERT(env->GetDataType(buffering_state_id));
			out_cc->println("if ( %s == 0 )", env->RValue(buffering_state_id));
			out_cc->inc_indent();
			out_cc->println("{");

			if ( attr_length_expr_ )
				{
				// frame_buffer_arg = attr_length_expr_->EvalExpr(out_cc, env);
				frame_buffer_arg = strfmt("%d", InitialBufferLength());
				}
			else if ( attr_restofflow_ )
				{
				ASSERT(attr_chunked());
				frame_buffer_arg = "-1";
				}
			else
				{
				ASSERT(0);
				}

			out_cc->println("%s->NewFrame(%s, %s);", env->LValue(flow_buffer_id),
			                frame_buffer_arg.c_str(), attr_chunked() ? "true" : "false");

			out_cc->println("%s = 1;", env->LValue(buffering_state_id));
			out_cc->println("}");
			out_cc->dec_indent();
			break;

		case BUFFER_BY_LINE:
			ASSERT(env->GetDataType(buffering_state_id));
			out_cc->println("if ( %s == 0 )", env->RValue(buffering_state_id));
			out_cc->inc_indent();
			out_cc->println("{");

			if ( BufferableWithLineBreaker() )
				out_cc->println("%s->SetLineBreaker((unsigned char*)%s);",
				                env->LValue(flow_buffer_id), LineBreaker()->orig());
			else
				out_cc->println("%s->UnsetLineBreaker();", env->LValue(flow_buffer_id));

			out_cc->println("%s->NewLine();", env->LValue(flow_buffer_id));

			out_cc->println("%s = 1;", env->LValue(buffering_state_id));
			out_cc->println("}");
			out_cc->dec_indent();
			break;

		default:
			ASSERT(0);
			break;
		}
	}